

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_memory_buffer<char,_250UL,_std::allocator<char>_> * __thiscall
fmt::v8::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::operator=
          (basic_memory_buffer<char,_250UL,_std::allocator<char>_> *this,
          basic_memory_buffer<char,_250UL,_std::allocator<char>_> *other)

{
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *other_local;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *this_local;
  
  if (this != other) {
    deallocate(this);
    move(this,other);
    return this;
  }
  v8::detail::assert_fail
            ("/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/fmt/format.h"
             ,0x2cf,"");
}

Assistant:

auto operator=(basic_memory_buffer&& other) FMT_NOEXCEPT
      -> basic_memory_buffer& {
    FMT_ASSERT(this != &other, "");
    deallocate();
    move(other);
    return *this;
  }